

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O3

int enet_peer_throttle(ENetPeer *peer,enet_uint32 rtt)

{
  int iVar1;
  enet_uint32 eVar2;
  uint uVar3;
  
  uVar3 = peer->lastRoundTripTime;
  if (uVar3 <= peer->lastRoundTripTimeVariance) {
    peer->packetThrottle = peer->packetThrottleLimit;
    return 0;
  }
  if (uVar3 < rtt) {
    iVar1 = 0;
    if (uVar3 + peer->lastRoundTripTimeVariance * 2 < rtt) {
      eVar2 = peer->packetThrottle - peer->packetThrottleDeceleration;
      if (peer->packetThrottle < peer->packetThrottleDeceleration) {
        eVar2 = 0;
      }
      peer->packetThrottle = eVar2;
      iVar1 = -1;
    }
    return iVar1;
  }
  uVar3 = peer->packetThrottle + peer->packetThrottleAcceleration;
  if (peer->packetThrottleLimit <= uVar3) {
    uVar3 = peer->packetThrottleLimit;
  }
  peer->packetThrottle = uVar3;
  return 1;
}

Assistant:

int
enet_peer_throttle (ENetPeer * peer, enet_uint32 rtt)
{
    if (peer -> lastRoundTripTime <= peer -> lastRoundTripTimeVariance)
    {
        peer -> packetThrottle = peer -> packetThrottleLimit;
    }
    else
    if (rtt <= peer -> lastRoundTripTime)
    {
        peer -> packetThrottle += peer -> packetThrottleAcceleration;

        if (peer -> packetThrottle > peer -> packetThrottleLimit)
          peer -> packetThrottle = peer -> packetThrottleLimit;

        return 1;
    }
    else
    if (rtt > peer -> lastRoundTripTime + 2 * peer -> lastRoundTripTimeVariance)
    {
        if (peer -> packetThrottle > peer -> packetThrottleDeceleration)
          peer -> packetThrottle -= peer -> packetThrottleDeceleration;
        else
          peer -> packetThrottle = 0;

        return -1;
    }

    return 0;
}